

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int attach_set_target(ATTACH_HANDLE attach,AMQP_VALUE target_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x11e6;
  }
  else {
    if (target_value == (AMQP_VALUE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(target_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x11f6;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,6,item_value);
      iVar2 = 0x11fc;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_target(ATTACH_HANDLE attach, AMQP_VALUE target_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE target_amqp_value;
        if (target_value == NULL)
        {
            target_amqp_value = NULL;
        }
        else
        {
            target_amqp_value = amqpvalue_clone(target_value);
        }
        if (target_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 6, target_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(target_amqp_value);
        }
    }

    return result;
}